

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.cpp
# Opt level: O1

QueryResult *
QueryResult::do_min_of_real
          (QueryResult *__return_storage_ptr__,int cutoff,
          vector<QueryResult_*,_std::allocator<QueryResult_*>_> *sources)

{
  pointer ppQVar1;
  QueryResult *pQVar2;
  int iVar3;
  pointer ppQVar4;
  ulong uVar5;
  vector<SortedRun_*,_std::allocator<SortedRun_*>_> nontrivial_sources;
  vector<SortedRun_*,_std::allocator<SortedRun_*>_> local_78;
  SortedRun local_60;
  
  local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppQVar4 = (sources->super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppQVar1 = (sources->super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppQVar4 != ppQVar1) {
    do {
      pQVar2 = *ppQVar4;
      if (pQVar2->has_everything == true) {
        cutoff = cutoff + -1;
      }
      else if (((pQVar2->results).sequence_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pQVar2->results).sequence_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) ||
              ((pQVar2->results).run_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start !=
               (pQVar2->results).run_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
        local_60.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pQVar2;
        std::vector<SortedRun*,std::allocator<SortedRun*>>::emplace_back<SortedRun*>
                  ((vector<SortedRun*,std::allocator<SortedRun*>> *)&local_78,
                   (SortedRun **)&local_60);
      }
      ppQVar4 = ppQVar4 + 1;
    } while (ppQVar4 != ppQVar1);
  }
  if (cutoff < 1) {
    (__return_storage_ptr__->results).run_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->results).run_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->results).sequence_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->results).run_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->results).sequence_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->results).sequence_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->has_everything = true;
  }
  else {
    iVar3 = (int)((ulong)((long)local_78.
                                super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_78.
                               super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3);
    if (iVar3 < cutoff) {
      empty();
    }
    else if (cutoff == iVar3) {
      SortedRun::SortedRun
                (&local_60,
                 *local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
                  super__Vector_impl_data._M_start);
      SortedRun::SortedRun(&__return_storage_ptr__->results,&local_60);
      __return_storage_ptr__->has_everything = false;
      if (local_60.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.run_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.run_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.run_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((QueryResult *)
          local_60.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (QueryResult *)0x0) {
        operator_delete(local_60.sequence_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.sequence_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.sequence_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (8 < (ulong)((long)local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                           _M_impl.super__Vector_impl_data._M_start)) {
        uVar5 = 1;
        do {
          SortedRun::do_and(&__return_storage_ptr__->results,
                            local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)local_78.
                                       super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_78.
                                       super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    else if (cutoff == 1) {
      SortedRun::SortedRun
                (&local_60,
                 *local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
                  super__Vector_impl_data._M_start);
      SortedRun::SortedRun(&__return_storage_ptr__->results,&local_60);
      __return_storage_ptr__->has_everything = false;
      if (local_60.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.run_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.run_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.run_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((QueryResult *)
          local_60.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (QueryResult *)0x0) {
        operator_delete(local_60.sequence_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.sequence_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.sequence_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (8 < (ulong)((long)local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                           _M_impl.super__Vector_impl_data._M_start)) {
        uVar5 = 1;
        do {
          SortedRun::do_or(&__return_storage_ptr__->results,
                           local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)local_78.
                                       super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_78.
                                       super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    else {
      SortedRun::pick_common(&local_60,cutoff,&local_78);
      SortedRun::SortedRun(&__return_storage_ptr__->results,&local_60);
      __return_storage_ptr__->has_everything = false;
      if (local_60.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.run_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.run_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.run_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((QueryResult *)
          local_60.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (QueryResult *)0x0) {
        operator_delete(local_60.sequence_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.sequence_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.sequence_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  if (local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

QueryResult QueryResult::do_min_of_real(int cutoff,
                                        std::vector<QueryResult *> &sources) {
    std::vector<SortedRun *> nontrivial_sources;
    for (QueryResult *source : sources) {
        if (source->is_everything()) {
            cutoff -= 1;
        } else if (!source->is_empty()) {
            nontrivial_sources.push_back(&source->vector());
        }
    }

    // '0 of (...)' should match everything.
    if (cutoff <= 0) {
        return QueryResult::everything();
    }

    // Short circuit when cutoff is too big.
    // This may happen when there are empty results in sources.
    if (cutoff > static_cast<int>(nontrivial_sources.size())) {
        return QueryResult::empty();
    }

    // Special case optimisation - reduction to AND.
    if (cutoff == static_cast<int>(nontrivial_sources.size())) {
        QueryResult out{nontrivial_sources[0]->clone()};
        for (int i = 1; i < nontrivial_sources.size(); i++) {
            out.results.do_and(*nontrivial_sources[i]);
        }
        return out;
    }

    // Special case optimisation - reduction to OR.
    if (cutoff == 1) {
        QueryResult out{nontrivial_sources[0]->clone()};
        for (int i = 1; i < nontrivial_sources.size(); i++) {
            out.results.do_or(*nontrivial_sources[i]);
        }
        return out;
    }

    return QueryResult(SortedRun::pick_common(cutoff, nontrivial_sources));
}